

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTableGet(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  BasicHeapType local_54;
  HeapType local_50;
  size_t local_48;
  char *local_40;
  BasicHeapType local_34;
  HeapType local_30;
  anon_class_8_1_8991fb9c local_28;
  anon_class_8_1_8991fb9c makeTableGet;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_28.this = this;
  makeTableGet.this = this;
  this_local = (TranslateToFuzzReader *)type.id;
  local_30 = Type::getHeapType((Type *)&this_local);
  local_34 = exn;
  bVar1 = HeapType::operator==(&local_30,&local_34);
  if (bVar1) {
    local_48 = (this->exnrefTableName).super_IString.str._M_len;
    local_40 = (this->exnrefTableName).super_IString.str._M_str;
    type_local.id =
         (uintptr_t)
         TranslateToFuzzReader::makeTableGet::anon_class_8_1_8991fb9c::operator()
                   (&local_28,(Name)(this->exnrefTableName).super_IString.str);
  }
  else {
    local_50 = Type::getHeapType((Type *)&this_local);
    local_54 = func;
    bVar1 = HeapType::operator==(&local_50,&local_54);
    if (!bVar1) {
      wasm::handle_unreachable
                ("bad TableGet type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x1276);
    }
    type_local.id =
         (uintptr_t)
         TranslateToFuzzReader::makeTableGet::anon_class_8_1_8991fb9c::operator()
                   (&local_28,(Name)(this->funcrefTableName).super_IString.str);
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeTableGet(Type type) {
  // Emit a get from the funcref table (which always exists) or the exnref one
  // (which might not, if EH is disabled).
  auto makeTableGet = [&](Name tableName) {
    auto* table = wasm.getTable(tableName);
    // Usually emit in-bounds gets, to avoid trapping, but rarely allow
    // anything.
    Expression* index;
    if (allowOOB && oneIn(10)) {
      index = make(table->addressType);
    } else {
      index = builder.makeConst(
        Literal::makeFromInt32(upTo(table->initial), table->addressType));
    }
    return builder.makeTableGet(tableName, index, table->type);
  };
  if (type.getHeapType() == HeapType::exn) {
    return makeTableGet(exnrefTableName);
  } else if (type.getHeapType() == HeapType::func) {
    return makeTableGet(funcrefTableName);
  } else {
    WASM_UNREACHABLE("bad TableGet type");
  }
}